

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcache.c
# Opt level: O3

void duckdb_je_tcache_stats_merge(tsdn_t *tsdn,tcache_t *tcache,arena_t *arena)

{
  witness_t **ppwVar1;
  uint64_t *puVar2;
  long *plVar3;
  int iVar4;
  bin_t *mutex;
  tcache_slow_t *ptVar5;
  pthread_mutex_t *__mutex;
  ulong uVar6;
  mutex_prof_data_t *data;
  long lVar7;
  
  ptVar5 = tcache->tcache_slow;
  if (ptVar5->tcache_nbins != 0) {
    lVar7 = 0x10;
    uVar6 = 0;
    do {
      if (*(uintptr_t **)((long)tcache->bins + lVar7 + -0x10) != &duckdb_je_disabled_bin) {
        if (uVar6 < 0x24) {
          mutex = duckdb_je_arena_bin_choose(tsdn,arena,(szind_t)uVar6,(uint *)0x0);
          __mutex = (pthread_mutex_t *)((long)&(mutex->lock).field_0 + 0x48);
          iVar4 = pthread_mutex_trylock(__mutex);
          if (iVar4 != 0) {
            duckdb_je_malloc_mutex_lock_slow(&mutex->lock);
            (mutex->lock).field_0.field_0.locked.repr = true;
          }
          puVar2 = &(mutex->lock).field_0.field_0.prof_data.n_lock_ops;
          *puVar2 = *puVar2 + 1;
          if ((mutex->lock).field_0.field_0.prof_data.prev_owner != tsdn) {
            (mutex->lock).field_0.field_0.prof_data.prev_owner = tsdn;
            ppwVar1 = &(mutex->lock).field_0.witness.link.qre_prev;
            *ppwVar1 = (witness_t *)((long)&(*ppwVar1)->name + 1);
          }
          puVar2 = &(mutex->stats).nrequests;
          *puVar2 = *puVar2 + *(long *)((long)tcache->bins + lVar7 + -8);
          (mutex->lock).field_0.field_0.locked.repr = false;
          pthread_mutex_unlock(__mutex);
        }
        else {
          LOCK();
          plVar3 = (long *)((long)arena + lVar7 * 2 + -0x2f0);
          *plVar3 = *plVar3 + *(long *)((long)tcache->bins + lVar7 + -8);
          UNLOCK();
          LOCK();
          plVar3 = (long *)((long)arena + lVar7 * 2 + -0x2e0);
          *plVar3 = *plVar3 + 1;
          UNLOCK();
        }
        *(undefined8 *)((long)tcache->bins + lVar7 + -8) = 0;
        ptVar5 = tcache->tcache_slow;
      }
      uVar6 = uVar6 + 1;
      lVar7 = lVar7 + 0x18;
    } while (uVar6 < ptVar5->tcache_nbins);
  }
  return;
}

Assistant:

void
tcache_stats_merge(tsdn_t *tsdn, tcache_t *tcache, arena_t *arena) {
	cassert(config_stats);

	/* Merge and reset tcache stats. */
	for (unsigned i = 0; i < tcache_nbins_get(tcache->tcache_slow); i++) {
		cache_bin_t *cache_bin = &tcache->bins[i];
		if (tcache_bin_disabled(i, cache_bin, tcache->tcache_slow)) {
			continue;
		}
		if (i < SC_NBINS) {
			bin_t *bin = arena_bin_choose(tsdn, arena, i, NULL);
			malloc_mutex_lock(tsdn, &bin->lock);
			bin->stats.nrequests += cache_bin->tstats.nrequests;
			malloc_mutex_unlock(tsdn, &bin->lock);
		} else {
			arena_stats_large_flush_nrequests_add(tsdn,
			    &arena->stats, i, cache_bin->tstats.nrequests);
		}
		cache_bin->tstats.nrequests = 0;
	}
}